

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freelist.h
# Opt level: O3

mecab_learner_node_t * __thiscall
MeCab::FreeList<mecab_learner_node_t>::alloc(FreeList<mecab_learner_node_t> *this)

{
  iterator __position;
  undefined1 auVar1 [16];
  long lVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  mecab_learner_node_t *local_30;
  
  uVar5 = *(ulong *)(this + 0x20);
  lVar4 = *(long *)(this + 0x28);
  if (uVar5 == *(ulong *)(this + 0x30)) {
    lVar4 = lVar4 + 1;
    *(long *)(this + 0x28) = lVar4;
    *(undefined8 *)(this + 0x20) = 0;
    uVar5 = 0;
  }
  lVar2 = *(long *)(this + 8);
  __position._M_current = *(mecab_learner_node_t ***)(this + 0x10);
  if (lVar4 == (long)__position._M_current - lVar2 >> 3) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = *(ulong *)(this + 0x30);
    uVar3 = 0xffffffffffffffff;
    if (SUB168(auVar1 * ZEXT816(0x98),8) == 0) {
      uVar3 = SUB168(auVar1 * ZEXT816(0x98),0);
    }
    local_30 = (mecab_learner_node_t *)operator_new__(uVar3);
    if (__position._M_current == *(mecab_learner_node_t ***)(this + 0x18)) {
      std::vector<mecab_learner_node_t*,std::allocator<mecab_learner_node_t*>>::
      _M_realloc_insert<mecab_learner_node_t*>
                ((vector<mecab_learner_node_t*,std::allocator<mecab_learner_node_t*>> *)(this + 8),
                 __position,&local_30);
      uVar5 = *(ulong *)(this + 0x20);
      lVar4 = *(long *)(this + 0x28);
    }
    else {
      *__position._M_current = local_30;
      *(long *)(this + 0x10) = *(long *)(this + 0x10) + 8;
    }
    lVar2 = *(long *)(this + 8);
  }
  lVar4 = *(long *)(lVar2 + lVar4 * 8);
  *(ulong *)(this + 0x20) = uVar5 + 1;
  return (mecab_learner_node_t *)(uVar5 * 0x98 + lVar4);
}

Assistant:

T* alloc() {
    if (pi_ == size) {
      li_++;
      pi_ = 0;
    }
    if (li_ == freeList.size()) freeList.push_back(new T[size]);
    return freeList[li_] + (pi_++);
  }